

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O3

void __thiscall BoundaryElement::run_GMRES(BoundaryElement *this)

{
  Timers_BoundaryElement *pTVar1;
  Output *pOVar2;
  pointer work;
  int iVar3;
  rep rVar4;
  double *h;
  ostream *poVar5;
  value_type_conflict1 *__val;
  long lVar6;
  long n;
  allocator_type local_51;
  long num_iter;
  double residual;
  vector<double,_std::allocator<double>_> work_vec;
  
  pTVar1 = this->timers_;
  rVar4 = std::chrono::_V2::steady_clock::now();
  (pTVar1->run_GMRES).start_time_.__d.__r = rVar4;
  lVar6 = (long)(this->output_->potential_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->output_->potential_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  n = lVar6 >> 3;
  residual = 0.0001;
  num_iter = 100;
  std::vector<double,_std::allocator<double>_>::vector(&work_vec,lVar6 * 2 + n * -2,&local_51);
  h = (double *)operator_new(0x420);
  memset(h,0,0x420);
  work = work_vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  copyin_clusters_to_device(this);
  iVar3 = gmres_(this,n,(this->elements_->source_term_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                 (this->output_->potential_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start,10,work,n,h,0xb,&num_iter,&residual);
  delete_clusters_from_device(this);
  pOVar2 = this->output_;
  pOVar2->residual_ = residual;
  pOVar2->num_iter_ = num_iter;
  if (iVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GMRES completed. ",0x11);
    poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," iterations, ",0xd);
    poVar5 = std::ostream::_M_insert<double>(residual);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," residual.",10);
    pTVar1 = this->timers_;
    lVar6 = std::chrono::_V2::steady_clock::now();
    (pTVar1->run_GMRES).end_time_.__d.__r = lVar6;
    (pTVar1->run_GMRES).elapsed_time_.__r =
         (double)(lVar6 - (pTVar1->run_GMRES).start_time_.__d.__r) / 1000000.0 +
         (pTVar1->run_GMRES).elapsed_time_.__r;
    operator_delete(h,0x420);
    if (work_vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(work_vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)work_vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)work_vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GMRES error code ",0x11)
  ;
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::operator<<(poVar5,". Exiting.");
  exit(1);
}

Assistant:

void BoundaryElement::run_GMRES()
{
    timers_.run_GMRES.start();

    long int restrt = 10;
    long int length = output_.potential().size();
    long int ldw    = length;
    long int ldh    = restrt + 1;
    
    // These values are modified on return
    double residual   = 1e-4;
    long int num_iter = 100;

    std::vector<double> work_vec(ldw * (restrt + 4));
    std::vector<double> h_vec   (ldh * (restrt + 2));
    
    double* work = work_vec.data();
    double* h    = h_vec.data();

    BoundaryElement::copyin_clusters_to_device();
    
    int err_code = BoundaryElement::gmres_(length, elements_.source_term_ptr(), output_.potential().data(),
                                    restrt, work, ldw, h, ldh, num_iter, residual);

    BoundaryElement::delete_clusters_from_device();
    
    output_.set_residual(residual);
    output_.set_num_iter(num_iter);

    if (err_code) {
        std::cout << "GMRES error code " << err_code << ". Exiting.";
        std::exit(1);
    }
    
    std::cout << "GMRES completed. " << num_iter << " iterations, " << residual << " residual.";

    timers_.run_GMRES.stop();
}